

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::PyiGenerator::PrintImportForDescriptor
          (PyiGenerator *this,FileDescriptor *desc,
          flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *seen_aliases,bool *has_importlib)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool *pbVar3;
  PyiGenerator *pPVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  AlphaNum *pAVar7;
  char *extraout_RDX;
  AlphaNum *in_R9;
  AlphaNum *pAVar8;
  string_view filename_00;
  string_view module_name_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string alias;
  string import_statement;
  string_view module_name;
  string_view filename;
  string module_name_owned;
  string local_1b0;
  AlphaNum local_190;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_160;
  pointer local_158;
  bool *local_150;
  PyiGenerator *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  string local_100;
  string local_e0;
  AlphaNum local_c0;
  undefined1 local_90 [48];
  AlphaNum local_60;
  
  local_110._M_str = (desc->name_->_M_dataplus)._M_p;
  local_110._M_len = desc->name_->_M_string_length;
  filename_00._M_str = has_importlib;
  filename_00._M_len = (size_t)local_110._M_str;
  StrippedModuleName_abi_cxx11_(&local_100,(python *)local_110._M_len,filename_00);
  _Var5._M_p = local_100._M_dataplus._M_p;
  local_120._M_len = local_100._M_string_length;
  local_120._M_str = local_100._M_dataplus._M_p;
  pAVar7 = (AlphaNum *)local_100._M_string_length;
  if ((AlphaNum *)local_100._M_string_length == (AlphaNum *)0x0) {
LAB_00e277f3:
    pAVar8 = (AlphaNum *)0xffffffffffffffff;
  }
  else {
    do {
      pAVar8 = (AlphaNum *)(pAVar7[-1].digits_ + 0x1f);
      if (pAVar7 == (AlphaNum *)0x0) goto LAB_00e277f3;
      pcVar1 = local_100._M_dataplus._M_p + -1 + (long)pAVar7;
      pAVar7 = pAVar8;
    } while (*pcVar1 != '.');
  }
  local_190.piece_._M_str = "_";
  local_190.piece_._M_len = 1;
  pAVar7 = (AlphaNum *)((long)&(pAVar8->piece_)._M_len + 1);
  local_160 = (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100._M_string_length - (long)pAVar7);
  if (local_100._M_string_length < pAVar7) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pAVar7
              );
  }
  local_158 = local_100._M_dataplus._M_p + (long)(pAVar7->digits_ + -0x10);
  pAVar7 = (AlphaNum *)local_100._M_string_length;
  local_150 = has_importlib;
  local_148 = this;
  local_c0.piece_._M_len = (size_t)local_160;
  local_c0.piece_._M_str = local_158;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)&local_190,&local_c0,(AlphaNum *)local_100._M_string_length)
  ;
  while( true ) {
    local_190.piece_ =
         (string_view)
         absl::lts_20250127::container_internal::
         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
         ::find<std::__cxx11::string>
                   ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                     *)seen_aliases,&local_1b0);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::AssertNotDebugCapacity
              (&seen_aliases->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    local_c0.piece_._M_len = 0;
    bVar6 = absl::lts_20250127::container_internal::operator==
                      ((iterator *)&local_190,(iterator *)&local_c0);
    if (bVar6) break;
    local_190.piece_._M_str = "_1";
    local_190.piece_._M_len = 2;
    absl::lts_20250127::StrAppend(&local_1b0,&local_190);
  }
  module_name_00._M_str = extraout_RDX;
  module_name_00._M_len = (size_t)_Var5._M_p;
  bVar6 = ContainsPythonKeyword((python *)local_100._M_string_length,module_name_00);
  pPVar4 = local_148;
  pbVar3 = local_150;
  if (bVar6) {
    if (*local_150 == false) {
      text._M_str = "import importlib\n";
      text._M_len = 0x11;
      io::Printer::Print<>(local_148->printer_,text);
      *pbVar3 = true;
    }
    text_00._M_str = "$alias$ = importlib.import_module(\'$name$\')\n";
    text_00._M_len = 0x2c;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>>
              (pPVar4->printer_,text_00,(char (*) [6])0x1302d08,&local_1b0,(char (*) [5])0x10a9ad3,
               &local_120);
    goto LAB_00e27b18;
  }
  paVar2 = &local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_140._M_dataplus._M_p = (pointer)paVar2;
  if (pAVar8 == (AlphaNum *)0xffffffffffffffff) {
    local_190.piece_._M_str = (char *)(slot_type *)0x130545b;
    local_190.piece_._M_len = (size_t)&DAT_00000007;
    local_c0.piece_._M_len = local_100._M_string_length;
    local_c0.piece_._M_str = _Var5._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_90,(lts_20250127 *)&local_190,&local_c0,pAVar7);
    std::__cxx11::string::operator=((string *)&local_140,(string *)local_90);
    local_e0._M_dataplus._M_p = (pointer)local_90._0_8_;
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) goto LAB_00e27a7b;
  }
  else {
    local_190.piece_._M_str = (char *)(slot_type *)0x13e2727;
    local_190.piece_._M_len = (size_t)&DAT_00000005;
    local_c0.piece_._M_len = (size_t)pAVar8;
    if (local_100._M_string_length < pAVar8) {
      local_c0.piece_._M_len = local_100._M_string_length;
    }
    local_c0.piece_._M_str = _Var5._M_p;
    local_90._0_8_ = &DAT_00000008;
    local_90._8_8_ = " import ";
    local_60.piece_._M_len = (size_t)local_160;
    local_60.piece_._M_str = local_158;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_e0,(lts_20250127 *)&local_190,&local_c0,(AlphaNum *)local_90,&local_60,in_R9);
    std::__cxx11::string::operator=((string *)&local_140,(string *)&local_e0);
    local_90._16_8_ = local_e0.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
LAB_00e27a7b:
      operator_delete(local_e0._M_dataplus._M_p,local_90._16_8_ + 1);
    }
  }
  text_01._M_str = "$statement$ as $alias$\n";
  text_01._M_len = 0x17;
  io::Printer::Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string>
            (pPVar4->printer_,text_01,(char (*) [10])"statement",&local_140,(char (*) [6])0x1302d08,
             &local_1b0);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::try_emplace_impl<std::basic_string_view<char,std::char_traits<char>>const&>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_190,
             (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&pPVar4->import_map_,&local_110);
  std::__cxx11::string::_M_assign((string *)((long)local_190.piece_._M_str + 0x20));
  local_c0.piece_._M_len = (size_t)seen_aliases;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  ::EmplaceDecomposable::operator()
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
              *)&local_190,&local_c0,&local_1b0,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
LAB_00e27b18:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PyiGenerator::PrintImportForDescriptor(
    const FileDescriptor& desc, absl::flat_hash_set<std::string>* seen_aliases,
    bool* has_importlib) const {
  const absl::string_view filename = desc.name();
  std::string module_name_owned = StrippedModuleName(filename);
  absl::string_view module_name(module_name_owned);
  size_t last_dot_pos = module_name.rfind('.');
  std::string alias = absl::StrCat("_", module_name.substr(last_dot_pos + 1));
  // Generate a unique alias by adding _1 suffixes until we get an unused alias.
  while (seen_aliases->find(alias) != seen_aliases->end()) {
    absl::StrAppend(&alias, "_1");
  }
  if (ContainsPythonKeyword(module_name)) {
    if (*has_importlib == false) {
      printer_->Print("import importlib\n");
      *has_importlib = true;
    }
    printer_->Print("$alias$ = importlib.import_module('$name$')\n", "alias",
                    alias, "name", module_name);
  } else {
    std::string import_statement;
    if (last_dot_pos == std::string::npos) {
      import_statement = absl::StrCat("import ", module_name);
    } else {
      import_statement =
          absl::StrCat("from ", module_name.substr(0, last_dot_pos), " import ",
                       module_name.substr(last_dot_pos + 1));
    }
    printer_->Print("$statement$ as $alias$\n", "statement", import_statement,
                    "alias", alias);
    import_map_[filename] = alias;
    seen_aliases->insert(alias);
  }
}